

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::~MakeCurrentPerfCase(MakeCurrentPerfCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MakeCurrentPerfCase_01e01b88;
  deinit(this);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::~_Vector_base
            (&(this->m_pixmaps).
              super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>);
  std::_Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::~_Vector_base
            (&(this->m_windows).
              super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>);
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

MakeCurrentPerfCase::~MakeCurrentPerfCase (void)
{
	deinit();
}